

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O2

int pay(int choice,int num,double income)

{
  int iVar1;
  ostream *poVar2;
  double *pdVar3;
  bool bVar4;
  double dVar5;
  double local_58;
  double local_50;
  double input;
  double local_38;
  
  local_58 = (double)num * ITEM[choice].price;
  if (isVIP) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Since you are our VIP, you got 25% off!");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_58 = local_58 * 0.75;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Please pay ");
  poVar2 = std::ostream::_M_insert<double>(local_58);
  poVar2 = std::operator<<(poVar2," yuan");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = 1;
  pdVar3 = &balance;
  local_50 = income;
  do {
    std::istream::_M_extract<double>((double *)&std::cin);
    dVar5 = local_50 + 0.0;
    if ((local_58 < dVar5) && (dVar5 - local_58 <= balance)) {
      local_38 = dVar5;
      iVar1 = deal(0,&local_38,&balance,local_58);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"back");
      std::endl<char,std::char_traits<char>>(poVar2);
      deliver(0,choice,num);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      buttonback();
LAB_00103325:
      if (iVar1 == 0) {
        return 0;
      }
      break;
    }
    if (balance < dVar5 - local_58) {
      local_38 = dVar5;
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Sorry, there\'s not enough balance in the machine!");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"Refunding...Please wait...");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      pdVar3 = (double *)0xffffffffffffffff;
      deal(-1,&local_38,&balance,local_58);
      iVar1 = deal(-1,&local_38,&balance,local_58);
      goto LAB_00103325;
    }
    local_50 = dVar5;
    if ((dVar5 == local_58) && (!NAN(dVar5) && !NAN(local_58))) goto LAB_00103338;
    if (dVar5 < local_58) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Sorry! The money you paid is not enough! Please pay more!");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar1 = -1;
    }
    bVar4 = iVar1 == -1;
    iVar1 = -1;
  } while (bVar4);
  detect(999);
LAB_00103338:
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"back");
  std::endl<char,std::char_traits<char>>(poVar2);
  *pdVar3 = local_50 + *pdVar3;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  buttonback();
  *pdVar3 = *pdVar3 + 0.0;
  return 0;
}

Assistant:

int pay(int choice, int num, double income) { //�����ɹ�����0�����󷵻�-1
    double pr = ITEM[choice].price * num, input = 0;
    if (isVIP) {
        cout << "Since you are our VIP, you got 25% off!" << endl;
        pr *= 3.0 / 4;
    }
    int signal, detection, isok = 1;
    frame
    cout << "Please pay " << pr << " yuan" << endl;
    frame
    do {
        cin >> input;
        income += input;
        if (income > pr && income - pr <= balance) {
            signal = 0;
            detection = deal(signal, income, balance, pr);
            frame
            cout << "Payment is successful! Thank you!" << endl << endl << endl << "back" << endl;
            deliver(signal, choice, num);
            isok = 0;
            frame
            buttonback();

        } else if (income - pr > balance) {
            frame
            cout << "Sorry, there's not enough balance in the machine!" << endl << "Refunding...Please wait..." << endl;
            frame
            signal = -1;
            deal(signal, income, balance, pr);
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income == pr) {
            frame
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            signal = 1;
            deal(signal, income, balance, pr);
            frame
            buttonback();
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income < pr) {
            cout << "Sorry! The money you paid is not enough! Please pay more!" << endl;
            isok = -1;
            /*int button = 1;
          if (button == 2) {
                signal = -1;
                detection = deal(signal, income, balance, pr);
                break;
            }*/
        }
    } while (isok == -1);
    if (detection == isok) {
        return isok;
    } else {
        detect(999);
    }
}